

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_GetStringViewWithOneof_Test::
~GeneratedMessageReflectionTest_GetStringViewWithOneof_Test
          (GeneratedMessageReflectionTest_GetStringViewWithOneof_Test *this)

{
  GeneratedMessageReflectionTest_GetStringViewWithOneof_Test *this_local;
  
  ~GeneratedMessageReflectionTest_GetStringViewWithOneof_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, GetStringViewWithOneof) {
  unittest::TestOneof2 message;
  const Reflection* reflection = message.GetReflection();
  const FieldDescriptor* string_field =
      message.GetDescriptor()->FindFieldByName("foo_string");
  const FieldDescriptor* string_piece_field =
      message.GetDescriptor()->FindFieldByName("foo_string_piece");
  Reflection::ScratchSpace scratch;

  message.set_foo_string("foo");
  EXPECT_EQ("foo", reflection->GetStringView(message, string_field, scratch));
  EXPECT_EQ("",
            reflection->GetStringView(message, string_piece_field, scratch));

}